

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

void __thiscall nnad::Matrix<double>::Transpose(Matrix<double> *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  vector<double,_std::allocator<double>_> new_Matrix;
  allocator_type local_21;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_20,(long)this->_Lines * (long)this->_Columns,&local_21);
  iVar1 = this->_Lines;
  lVar3 = (long)iVar1;
  uVar2 = this->_Columns;
  if (0 < lVar3) {
    pdVar4 = (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    pdVar5 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0 < (int)uVar2) {
        uVar8 = 0;
        pdVar7 = pdVar5;
        do {
          *pdVar7 = pdVar4[uVar8];
          uVar8 = uVar8 + 1;
          pdVar7 = pdVar7 + lVar3;
        } while (uVar2 != uVar8);
      }
      lVar6 = lVar6 + 1;
      pdVar4 = pdVar4 + uVar2;
      pdVar5 = pdVar5 + 1;
    } while (lVar6 != lVar3);
  }
  this->_Lines = uVar2;
  this->_Columns = iVar1;
  std::vector<double,_std::allocator<double>_>::operator=(&this->_Matrix,&local_20);
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Transpose()
    {
      std::vector<T> new_Matrix(_Columns * _Lines);
      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          new_Matrix[j*_Lines + i] = _Matrix[i * _Columns + j];

      const int temp = _Lines;
      _Lines   = _Columns;
      _Columns = temp;
      _Matrix  = new_Matrix;
    }